

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O0

string * __thiscall
ninx::lexer::Reader::read_identifier_abi_cxx11_
          (string *__return_storage_ptr__,Reader *this,int *trailing_spaces,int target_suffix,
          bool *found)

{
  bool bVar1;
  int iVar2;
  LexerException *this_00;
  char *pcVar3;
  allocator local_91;
  string local_90 [34];
  value_type_conflict local_6e [21];
  allocator local_59;
  string local_58;
  char local_32;
  char local_31;
  char current;
  bool *pbStack_30;
  char next_char;
  bool *found_local;
  int *piStack_20;
  int target_suffix_local;
  int *trailing_spaces_local;
  Reader *this_local;
  
  pbStack_30 = found;
  found_local._4_4_ = target_suffix;
  piStack_20 = trailing_spaces;
  trailing_spaces_local = (int *)this;
  this_local = (Reader *)__return_storage_ptr__;
  std::vector<char,_std::allocator<char>_>::clear(&this->buffer);
  while (bVar1 = std::ios::operator_cast_to_bool
                           ((ios *)(this->stream + *(long *)(*(long *)this->stream + -0x18))), bVar1
        ) {
    local_31 = std::istream::peek();
    iVar2 = isspace((int)local_31);
    if ((iVar2 != 0) ||
       (((bVar1 = is_limiter(local_31), bVar1 && (local_31 != '_')) ||
        (local_32 = std::istream::get(), local_32 == -1)))) break;
    iVar2 = isalpha((int)local_32);
    if (((iVar2 == 0) && (iVar2 = isdigit((int)local_32), iVar2 == 0)) &&
       ((local_32 != '.' && (local_32 != '_')))) {
      local_6e[1] = 1;
      this_00 = (LexerException *)__cxa_allocate_exception(0x20);
      iVar2 = this->line_number;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_58,"Identifier can only contain alphanumeric characters.",
                 &local_59);
      exception::LexerException::LexerException(this_00,iVar2,&this->origin,&local_58);
      local_6e[1] = 0;
      __cxa_throw(this_00,&exception::LexerException::typeinfo,
                  exception::LexerException::~LexerException);
    }
    std::vector<char,_std::allocator<char>_>::push_back(&this->buffer,&local_32);
  }
  local_6e[0] = '\0';
  std::vector<char,_std::allocator<char>_>::push_back(&this->buffer,local_6e);
  *pbStack_30 = false;
  if ((found_local._4_4_ != -1) && (iVar2 = std::istream::peek(), iVar2 == found_local._4_4_)) {
    std::istream::get();
    *pbStack_30 = true;
  }
  iVar2 = ignore_spaces(this);
  *piStack_20 = iVar2;
  pcVar3 = std::vector<char,_std::allocator<char>_>::data(&this->buffer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar3,&local_91);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::Reader::read_identifier(int &trailing_spaces, int target_suffix, bool &found) {
    this->buffer.clear();

    while (stream) {
        // An identifier is valid until a space or a limiter is found
        char next_char = static_cast<char>(stream.peek());
        if (isspace(next_char) || (is_limiter(next_char) && next_char != '_')) {
            break;
        }

        // Read the current char
        char current = static_cast<char>(stream.get());
        if (current == -1) {
            break;
        }

        // If the current char is not alphanumeric, underscore or dot ( used to call nested methods and variables ),
        // raise an exception
        if (isalpha(current) == 0 && isdigit(current) == 0 && current != '.' && current != '_') {
            throw LexerException(this->line_number, this->origin,
                                 "Identifier can only contain alphanumeric characters.");
        }

        this->buffer.push_back(current);
    }

    this->buffer.push_back(0);

    found = false;
    if (target_suffix != -1 && stream.peek() == target_suffix) {
        stream.get();
        found = true;
    }

    trailing_spaces = ignore_spaces();

    return std::move(std::string{buffer.data()});
}